

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofXyz.cpp
# Opt level: O1

void __thiscall
OpenMD::GofXyz::GofXyz
          (GofXyz *this,SimInfo *info,string *filename,string *sele1,string *sele2,string *sele3,
          RealType len,int nrbins)

{
  SelectionEvaluator *this_00;
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  *this_01;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  long *plVar3;
  size_type sVar4;
  pointer pOVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  undefined1 local_78 [24];
  long lStack_60;
  SelectionEvaluator *local_58;
  string local_50;
  
  RadialDistrFunc::RadialDistrFunc(&this->super_RadialDistrFunc,info,filename,sele1,sele2,nrbins);
  (this->super_RadialDistrFunc).super_StaticAnalyser._vptr_StaticAnalyser =
       (_func_int **)&PTR__GofXyz_0033a240;
  this->len_ = len;
  this->halfLen_ = len * 0.5;
  this_00 = &this->evaluator3_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  SelectionManager::SelectionManager(&this->seleMan3_,info);
  this_01 = &this->histogram_;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->histogram_).
  super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->rotMats_)._M_t._M_impl.super__Rb_tree_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->rotMats_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58 = this_00;
  getPrefix(&local_50,filename);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_50);
  pOVar5 = (pointer)(plVar3 + 2);
  if ((pointer)*plVar3 == pOVar5) {
    local_78._16_8_ =
         (pOVar5->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lStack_60 = plVar3[3];
    local_78._0_8_ = (pointer)(local_78 + 0x10);
  }
  else {
    local_78._16_8_ =
         (pOVar5->bitset_).super__Bvector_base<std::allocator<bool>_>._M_impl.
         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    local_78._0_8_ = (pointer)*plVar3;
  }
  local_78._8_8_ = plVar3[1];
  *plVar3 = (long)pOVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::__cxx11::string::_M_assign
            ((string *)&(this->super_RadialDistrFunc).super_StaticAnalyser.outputFilename_);
  if ((pointer)local_78._0_8_ != (pointer)(local_78 + 0x10)) {
    operator_delete((void *)local_78._0_8_,
                    (ulong)((long)&(((vector<bool,_std::allocator<bool>_> *)local_78._16_8_)->
                                   super__Bvector_base<std::allocator<bool>_>)._M_impl.
                                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p +
                           1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  SelectionEvaluator::loadScriptString(this_00,sele3);
  if ((this->evaluator3_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_78,this_00);
    lVar7 = 0;
    do {
      std::vector<bool,_std::allocator<bool>_>::operator=
                ((vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((this->seleMan3_).ss_.bitsets_.
                           super__Vector_base<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>
                           ._M_impl.super__Vector_impl_data._M_start)->bitset_).
                         super__Bvector_base<std::allocator<bool>_> + lVar7),
                 (vector<bool,_std::allocator<bool>_> *)
                 ((long)&(((vector<bool,_std::allocator<bool>_> *)local_78._0_8_)->
                         super__Bvector_base<std::allocator<bool>_>)._M_impl.
                         super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + lVar7));
      lVar7 = lVar7 + 0x28;
    } while (lVar7 != 0xf0);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_78);
  }
  uVar6 = (ulong)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  this->deltaR_ = this->len_ / (double)uVar6;
  std::
  vector<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
  ::resize(this_01,uVar6);
  uVar2 = (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
  sVar4 = (size_type)uVar2;
  if (uVar2 != 0) {
    uVar6 = 0;
    do {
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::resize((this_01->
               super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + uVar6,sVar4);
      uVar2 = (this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
      sVar4 = (size_type)uVar2;
      if (uVar2 != 0) {
        lVar7 = 0;
        uVar8 = 0;
        do {
          std::vector<int,_std::allocator<int>_>::resize
                    ((vector<int,_std::allocator<int>_> *)
                     (*(long *)&(this_01->
                                super__Vector_base<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>,_std::allocator<std::vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start[uVar6].
                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                ._M_impl.super__Vector_impl_data + lVar7),sVar4);
          uVar8 = uVar8 + 1;
          sVar4 = (size_type)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
          lVar7 = lVar7 + 0x18;
        } while (uVar8 < sVar4);
      }
      uVar6 = uVar6 + 1;
      sVar4 = (size_type)(this->super_RadialDistrFunc).super_StaticAnalyser.nBins_;
    } while (uVar6 < sVar4);
  }
  return;
}

Assistant:

GofXyz::GofXyz(SimInfo* info, const std::string& filename,
                 const std::string& sele1, const std::string& sele2,
                 const std::string& sele3, RealType len, int nrbins) :
      RadialDistrFunc(info, filename, sele1, sele2, nrbins),
      len_(len), halfLen_(len / 2), evaluator3_(info), seleMan3_(info) {
    setOutputName(getPrefix(filename) + ".gxyz");

    evaluator3_.loadScriptString(sele3);
    if (!evaluator3_.isDynamic()) {
      seleMan3_.setSelectionSet(evaluator3_.evaluate());
    }

    deltaR_ = len_ / nBins_;

    histogram_.resize(nBins_);
    for (unsigned int i = 0; i < nBins_; ++i) {
      histogram_[i].resize(nBins_);
      for (unsigned int j = 0; j < nBins_; ++j) {
        histogram_[i][j].resize(nBins_);
      }
    }
  }